

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O0

bool AM_clearMarks(void)

{
  bool bVar1;
  int local_c;
  int i;
  
  for (local_c = 9; -1 < local_c; local_c = local_c + -1) {
    markpoints[local_c].x = -1.0;
  }
  markpointnum = 0;
  bVar1 = FTextureID::isValid(marknums);
  return bVar1;
}

Assistant:

bool AM_clearMarks ()
{
	for (int i = AM_NUMMARKPOINTS-1; i >= 0; i--)
		markpoints[i].x = -1; // means empty
	markpointnum = 0;
	return marknums[0].isValid();
}